

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

void __thiscall ki::protocol::dml::Message::Message(Message *this,MessageTemplate *message_template)

{
  Record *this_00;
  Record *record;
  MessageTemplate *message_template_local;
  Message *this_local;
  
  util::Serializable::Serializable(&this->super_Serializable);
  (this->super_Serializable)._vptr_Serializable = (_func_int **)&PTR_write_to_00258dd8;
  MessageHeader::MessageHeader(&this->m_header,'\0','\0',0);
  std::vector<char,_std::allocator<char>_>::vector(&this->m_raw_data);
  this->m_template = message_template;
  if (this->m_template == (MessageTemplate *)0x0) {
    this->m_record = (Record *)0x0;
  }
  else {
    this_00 = (Record *)operator_new(0x50);
    record = MessageTemplate::get_record(this->m_template);
    ki::dml::Record::Record(this_00,record);
    this->m_record = this_00;
  }
  return;
}

Assistant:

Message::Message(const MessageTemplate *message_template)
	{
		m_template = message_template;
		if (m_template)
			m_record = new ki::dml::Record(m_template->get_record());
		else
			m_record = nullptr;
	}